

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

bool __thiscall BoardView::AnyItemVisible(BoardView *this)

{
  bool bVar1;
  BoardView *in_RDI;
  shared_ptr<Pin> *p_1;
  iterator __end3;
  iterator __begin3;
  SharedVector<Pin> *__range3;
  shared_ptr<Component> *p;
  iterator __end2;
  iterator __begin2;
  SharedVector<Component> *__range2;
  bool any_visible;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> local_80;
  shared_ptr<Pin> *local_68;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_60;
  SharedVector<Pin> *local_58;
  reference local_30;
  shared_ptr<Component> *local_28;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_20;
  SharedVector<Component> *local_18;
  byte local_9;
  
  local_9 = 0;
  if ((in_RDI->m_searchComponents & 1U) != 0) {
    local_18 = &in_RDI->m_partHighlighted;
    local_20._M_current =
         (shared_ptr<Component> *)
         std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
         begin(in_stack_ffffffffffffff58);
    local_28 = (shared_ptr<Component> *)
               std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
               ::end(in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                              (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      local_30 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                 ::operator*(&local_20);
      std::shared_ptr<BoardElement>::shared_ptr<Component,void>
                ((shared_ptr<BoardElement> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (shared_ptr<Component> *)in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff77 =
           BoardElementIsVisible
                     (in_RDI,(shared_ptr<BoardElement> *)
                             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      local_9 = (local_9 & 1) != 0 || (bool)in_stack_ffffffffffffff77;
      std::shared_ptr<BoardElement>::~shared_ptr((shared_ptr<BoardElement> *)0x12f397);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
      ::operator++(&local_20);
    }
  }
  if (((local_9 & 1) == 0) && ((in_RDI->m_searchNets & 1U) != 0)) {
    local_58 = &in_RDI->m_pinHighlighted;
    local_60._M_current =
         (shared_ptr<Pin> *)
         std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                   ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                    in_stack_ffffffffffffff58);
    local_68 = (shared_ptr<Pin> *)
               std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
                         ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                          in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                              (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      local_80.
      super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                    ::operator*(&local_60);
      std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x12f447);
      in_stack_ffffffffffffff58 = &local_80;
      std::shared_ptr<BoardElement>::shared_ptr<Component,void>
                ((shared_ptr<BoardElement> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (shared_ptr<Component> *)in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff67 =
           BoardElementIsVisible
                     (in_RDI,(shared_ptr<BoardElement> *)
                             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      local_9 = (local_9 & 1) != 0 || (bool)in_stack_ffffffffffffff67;
      std::shared_ptr<BoardElement>::~shared_ptr((shared_ptr<BoardElement> *)0x12f4a0);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
      ::operator++(&local_60);
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool BoardView::AnyItemVisible(void) {
	bool any_visible = false;

	if (m_searchComponents) {
		for (auto &p : m_partHighlighted) {
			any_visible |= BoardElementIsVisible(p);
		}
	}

	if (!any_visible) {
		if (m_searchNets) {
			for (auto &p : m_pinHighlighted) {
				any_visible |= BoardElementIsVisible(p->component);
			}
		}
	}

	return any_visible;
}